

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::BaseWindow::showBuffer(BaseWindow *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  size_type sVar6;
  undefined8 uVar7;
  int *piVar8;
  int iVar9;
  long in_RDI;
  int h_1;
  int w_1;
  size_t i;
  int h;
  int w;
  int y;
  int x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  bool in_stack_000000f6;
  char in_stack_000000f7;
  string *in_stack_000000f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000100;
  BaseWindowData *in_stack_00000150;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_54;
  ulong local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  pthread_mutex_lock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0xd0) & 1) != 0) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 0) {
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 0) {
        XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                  *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                  *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                  *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),0,0,0,0,
                  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x48),
                  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x4c));
      }
      else {
        uVar1 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x38);
        uVar7 = std::__cxx11::string::c_str();
        uVar3 = std::__cxx11::string::size();
        iVar4 = XTextWidth(uVar1,uVar7,uVar3);
        iVar9 = *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x38) + 0x58) +
                *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x38) + 0x5c);
        if ((*(byte *)(*(long *)(in_RDI + 8) + 0x98) & 1) == 0) {
          if (iVar4 < *(int *)(*(long *)(in_RDI + 8) + 0x48)) {
            if ((*(byte *)(*(long *)(in_RDI + 8) + 0x99) & 1) == 0) {
              XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),0,
                        *(int *)(*(long *)(in_RDI + 8) + 0x4c) - iVar9,0,
                        *(int *)(*(long *)(in_RDI + 8) + 0x4c) - iVar9,
                        *(int *)(*(long *)(in_RDI + 8) + 0x48) - iVar4,iVar9);
            }
            else {
              XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),iVar4,
                        *(int *)(*(long *)(in_RDI + 8) + 0x4c) - iVar9,iVar4,
                        *(int *)(*(long *)(in_RDI + 8) + 0x4c) - iVar9,
                        *(int *)(*(long *)(in_RDI + 8) + 0x48) - iVar4,iVar9);
            }
          }
          XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),0,0,0,0,
                    *(undefined4 *)(*(long *)(in_RDI + 8) + 0x48),
                    *(int *)(*(long *)(in_RDI + 8) + 0x4c) - iVar9);
        }
        else {
          if (iVar4 < *(int *)(*(long *)(in_RDI + 8) + 0x48)) {
            if ((*(byte *)(*(long *)(in_RDI + 8) + 0x99) & 1) == 0) {
              XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),0,0,0,0,
                        *(int *)(*(long *)(in_RDI + 8) + 0x48) - iVar4,iVar9);
            }
            else {
              XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),iVar4,0,iVar4,0,
                        *(int *)(*(long *)(in_RDI + 8) + 0x48) - iVar4,iVar9);
            }
          }
          XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
                    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
                    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),0,iVar9,0,iVar9,
                    *(undefined4 *)(*(long *)(in_RDI + 8) + 0x48),
                    *(int *)(*(long *)(in_RDI + 8) + 0x4c) - iVar9);
        }
        anon_unknown_0::drawInfoText(in_stack_00000150);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x157471);
      gutil::split(in_stack_00000100,in_stack_000000f8,in_stack_000000f7,in_stack_000000f6);
      local_38 = 0;
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
      for (local_50 = 0; uVar2 = local_50,
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_28), uVar2 < sVar6; local_50 = local_50 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_28,local_50);
        lVar5 = std::__cxx11::string::size();
        if (lVar5 != 0) {
          uVar1 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_28,local_50);
          uVar7 = std::__cxx11::string::c_str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_28,local_50);
          uVar3 = std::__cxx11::string::size();
          local_54 = XTextWidth(uVar1,uVar7,uVar3);
          piVar8 = std::max<int>(&local_40,&local_54);
          local_40 = *piVar8;
        }
        local_44 = *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x38) + 0x58) +
                   *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x38) + 0x5c) + local_44;
      }
      if (local_40 < *(int *)(*(long *)(in_RDI + 8) + 0x48)) {
        local_38 = (*(int *)(*(long *)(in_RDI + 8) + 0x48) - local_40) / 2 + local_38;
      }
      if (local_44 < *(int *)(*(long *)(in_RDI + 8) + 0x4c)) {
        local_3c = (*(int *)(*(long *)(in_RDI + 8) + 0x4c) - local_44) / 2 + local_3c;
      }
      if ((0 < local_3c) && (local_3c + local_44 < *(int *)(*(long *)(in_RDI + 8) + 0x4c))) {
        lVar5 = *(long *)(in_RDI + 8);
        XPutImage(*(undefined8 *)(lVar5 + 8),*(undefined8 *)(lVar5 + 0x18),
                  *(undefined8 *)(lVar5 + 0x30),*(undefined8 *)(lVar5 + 0x40),0,0,0,0,
                  *(undefined4 *)(lVar5 + 0x48),local_3c);
        lVar5 = *(long *)(in_RDI + 8);
        in_stack_ffffffffffffff40 = (*(int *)(lVar5 + 0x4c) - local_3c) - local_44;
        XPutImage(*(undefined8 *)(lVar5 + 8),*(undefined8 *)(lVar5 + 0x18),
                  *(undefined8 *)(lVar5 + 0x30),*(undefined8 *)(lVar5 + 0x40),0,local_3c + local_44,
                  0,local_3c + local_44,*(undefined4 *)(lVar5 + 0x48));
      }
      if ((0 < local_38) && (local_38 + local_40 < *(int *)(*(long *)(in_RDI + 8) + 0x48))) {
        lVar5 = *(long *)(in_RDI + 8);
        XPutImage(*(undefined8 *)(lVar5 + 8),*(undefined8 *)(lVar5 + 0x18),
                  *(undefined8 *)(lVar5 + 0x30),*(undefined8 *)(lVar5 + 0x40),0,local_3c,0,local_3c,
                  local_38,local_44);
        lVar5 = *(long *)(in_RDI + 8);
        in_stack_ffffffffffffff40 = local_44;
        XPutImage(*(undefined8 *)(lVar5 + 8),*(undefined8 *)(lVar5 + 0x18),
                  *(undefined8 *)(lVar5 + 0x30),*(undefined8 *)(lVar5 + 0x40),local_38 + local_40,
                  local_3c,local_38 + local_40,local_3c,
                  (*(int *)(lVar5 + 0x48) - local_38) - local_40);
      }
      anon_unknown_0::drawInfoText(in_stack_00000150);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
  return;
}

Assistant:

void BaseWindow::showBuffer()
{
  pthread_mutex_lock(&(p->mutex));

  if (p->running)
  {
    if (p->text.size() > 0)
    {
      // if text is displayed then draw whole image around text

      std::vector<std::string> list;
      gutil::split(list, p->text, '\n', false);

      int x=0, y=0;
      int w=0, h=0;

      for (size_t i=0; i<list.size(); i++)
      {
        if (list[i].size() > 0)
        {
          w=std::max(w, XTextWidth(p->font, list[i].c_str(), list[i].size()));
        }

        h+=p->font->ascent+p->font->descent;
      }

      if (p->w > w)
      {
        x+=(p->w-w)/2;
      }

      if (p->h > h)
      {
        y+=(p->h-h)/2;
      }

      if (y > 0 && p->h > y+h)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, y);
        XPutImage(p->display, p->window, p->gc, p->image, 0, y+h, 0, y+h, p->w, p->h-y-h);
      }

      if (x > 0 && p->w > x+w)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, y, 0, y, x, h);
        XPutImage(p->display, p->window, p->gc, p->image, x+w, y, x+w, y, p->w-x-w, h);
      }

      // draw text

      drawInfoText(p);
    }
    else if (p->info.size() > 0)
    {
      // if info line is displayed then draw whole image except line

      int w=XTextWidth(p->font, p->info.c_str(), p->info.size());
      int h=p->font->ascent+p->font->descent;

      if (p->top)
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, 0, w, 0, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, h, 0, h, p->w, p->h-h);
      }
      else
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, p->h-h, w, p->h-h, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, p->h-h, 0, p->h-h, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h-h);
      }

      // draw info line

      drawInfoText(p);
    }
    else
    {
      // draw whole image

      XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}